

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

char * __thiscall IrSim::print3(IrSim *this,C_IC *i)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  InterCode *this_00;
  C_OP *this_01;
  int *in_RSI;
  long in_RDI;
  int in_stack_fffffffffffffe8c;
  InterCode *in_stack_fffffffffffffe90;
  Operand *in_stack_fffffffffffffe98;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [40];
  C_IC *in_stack_ffffffffffffffa0;
  IrSim *in_stack_ffffffffffffffa8;
  string local_38 [48];
  char *local_8;
  
  if (in_RSI[0x1a] == 0) {
    local_8 = print2(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  else {
    if (*in_RSI < 0x14) {
      sVar1 = *(size_t *)(in_RDI + 0x60);
      pcVar2 = *(char **)(in_RDI + 0x68);
      pcVar3 = icFmt[*in_RSI];
      InterCode::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      Operand::str_abi_cxx11_(in_stack_fffffffffffffe98);
      uVar4 = std::__cxx11::string::c_str();
      InterCode::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      Operand::str_abi_cxx11_(in_stack_fffffffffffffe98);
      uVar5 = std::__cxx11::string::c_str();
      InterCode::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      Operand::str_abi_cxx11_(in_stack_fffffffffffffe98);
      uVar6 = std::__cxx11::string::c_str();
      snprintf(pcVar2,sVar1,pcVar3,uVar4,uVar5,uVar6);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
      std::__cxx11::string::~string(local_38);
    }
    else {
      sVar1 = *(size_t *)(in_RDI + 0x60);
      pcVar2 = *(char **)(in_RDI + 0x68);
      pcVar3 = icFmt[*in_RSI];
      InterCode::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      Operand::str_abi_cxx11_(in_stack_fffffffffffffe98);
      uVar4 = std::__cxx11::string::c_str();
      InterCode::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      Operand::str_abi_cxx11_(in_stack_fffffffffffffe98);
      this_00 = (InterCode *)std::__cxx11::string::c_str();
      this_01 = InterCode::operator[](this_00,in_stack_fffffffffffffe8c);
      Operand::str_abi_cxx11_(this_01);
      uVar5 = std::__cxx11::string::c_str();
      snprintf(pcVar2,sVar1,pcVar3,uVar4,this_00,uVar5);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_a8);
    }
    local_8 = *(char **)(in_RDI + 0x68);
  }
  return local_8;
}

Assistant:

const char *IrSim::print3(C_IC &i) const {
    if (i.arg2.kind == IR_NONE) return print2(i);
    if (i.kind < IC_RELOP)
        snprintf(pb, PBSIZE, icFmt[i.kind], i[0].str().c_str(), i[1].str().c_str(), i[2].str().c_str());
    else
        snprintf(pb, PBSIZE, icFmt[i.kind], i[1].str().c_str(), i[2].str().c_str(), i[0].str().c_str());
    return pb;
}